

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pass2.cpp
# Opt level: O0

string * __thiscall
cs222::Pass2::parseProgramLength_abi_cxx11_
          (string *__return_storage_ptr__,Pass2 *this,ifstream *ifs)

{
  _Ios_Openmode _Var1;
  string local_1f8 [8];
  string buffer;
  stringstream lineStream;
  string local_40 [8];
  string line;
  ifstream *ifs_local;
  Pass2 *this_local;
  string *progLength;
  
  line.field_2._8_8_ = ifs;
  std::__cxx11::string::string(local_40);
  std::getline<char,std::char_traits<char>,std::allocator<char>>
            ((istream *)line.field_2._8_8_,local_40);
  _Var1 = std::operator|(_S_out,_S_in);
  std::__cxx11::stringstream::stringstream
            ((stringstream *)(buffer.field_2._M_local_buf + 8),local_40,_Var1);
  std::__cxx11::string::string(local_1f8);
  std::operator>>((istream *)(buffer.field_2._M_local_buf + 8),local_1f8);
  std::operator>>((istream *)(buffer.field_2._M_local_buf + 8),local_1f8);
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  std::operator>>((istream *)(buffer.field_2._M_local_buf + 8),(string *)__return_storage_ptr__);
  std::__cxx11::string::~string(local_1f8);
  std::__cxx11::stringstream::~stringstream((stringstream *)(buffer.field_2._M_local_buf + 8));
  std::__cxx11::string::~string(local_40);
  return __return_storage_ptr__;
}

Assistant:

std::string Pass2::parseProgramLength(std::ifstream &ifs) {
        std::string line;
        getline(ifs, line);
        std::stringstream lineStream(line);
        std::string buffer;

        lineStream >> buffer; // Skip "PROGRAM"
        lineStream >> buffer; // Skip "LENGTH:"

        std::string progLength;
        lineStream >> progLength;
        return progLength;
    }